

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_alignment
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  Decoration *pDVar6;
  TypedID *this_00;
  SPIRType *type_00;
  uint *puVar7;
  CompilerError *pCVar8;
  allocator local_119;
  string local_118 [36];
  uint32_t local_f4;
  uint local_f0;
  uint32_t base_alignment;
  undefined1 local_e8 [8];
  Bitset member_flags;
  uint local_a0;
  uint32_t i;
  uint32_t alignment;
  SPIRType *tmp;
  uint32_t minimum_alignment;
  undefined1 local_65;
  allocator local_51;
  string local_50 [36];
  BufferPackingStandard local_2c;
  Bitset *pBStack_28;
  BufferPackingStandard packing_local;
  Bitset *flags_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  local_2c = packing;
  pBStack_28 = flags;
  flags_local = (Bitset *)type;
  type_local = (SPIRType *)this;
  bVar1 = Compiler::type_is_top_level_physical_pointer(&this->super_Compiler,type);
  if (bVar1) {
    if (((ulong)flags_local[1].higher._M_h._M_single_bucket & 0x100000000) == 0) {
      local_65 = 1;
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_50,"Types in PhysicalStorageBufferEXT must be pointers.",&local_51);
      CompilerError::CompilerError(pCVar8,(string *)local_50);
      local_65 = 0;
      __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((this->super_Compiler).ir.addressing_model != AddressingModelPhysicalStorageBuffer64) {
      tmp._6_1_ = 1;
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&minimum_alignment,
                 "AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT."
                 ,(allocator *)((long)&tmp + 7));
      CompilerError::CompilerError(pCVar8,(string *)&minimum_alignment);
      tmp._6_1_ = 0;
      __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar1 = packing_is_vec4_padded(local_2c);
    if ((bVar1) &&
       (bVar1 = Compiler::type_is_array_of_pointers(&this->super_Compiler,(SPIRType *)flags_local),
       bVar1)) {
      this_local._4_4_ = 0x10;
    }
    else {
      this_local._4_4_ = 8;
    }
  }
  else {
    bVar1 = Compiler::type_is_top_level_array(&this->super_Compiler,(SPIRType *)flags_local);
    if (bVar1) {
      tmp._0_4_ = 1;
      bVar1 = packing_is_vec4_padded(local_2c);
      if (bVar1) {
        tmp._0_4_ = 0x10;
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)((long)&flags_local[4].higher._M_h._M_bucket_count + 4));
      _alignment = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
      while (bVar1 = VectorView<unsigned_int>::empty
                               (&(_alignment->array).super_VectorView<unsigned_int>),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_alignment->parent_type);
        _alignment = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
      }
      i = type_to_packed_alignment(this,_alignment,pBStack_28,local_2c);
      puVar7 = ::std::max<unsigned_int>((uint *)&tmp,&i);
      this_local._4_4_ = *puVar7;
    }
    else if (*(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) == 0xf) {
      local_a0 = 1;
      for (member_flags.higher._M_h._M_single_bucket._4_4_ = 0;
          uVar3 = (ulong)member_flags.higher._M_h._M_single_bucket._4_4_,
          sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                             &flags_local[2].higher), uVar3 < sVar4;
          member_flags.higher._M_h._M_single_bucket._4_4_ =
               member_flags.higher._M_h._M_single_bucket._4_4_ + 1) {
        pmVar5 = ::std::
                 unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                 ::operator[](&(this->super_Compiler).ir.meta,(key_type *)&flags_local->higher);
        pDVar6 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                           (&(pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>,
                            (ulong)member_flags.higher._M_h._M_single_bucket._4_4_);
        Bitset::Bitset((Bitset *)local_e8,&pDVar6->decoration_flags);
        this_00 = (TypedID *)
                  VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                            ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                             &flags_local[2].higher,
                             (ulong)member_flags.higher._M_h._M_single_bucket._4_4_);
        uVar2 = TypedID::operator_cast_to_unsigned_int(this_00);
        type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
        base_alignment = type_to_packed_alignment(this,type_00,(Bitset *)local_e8,local_2c);
        puVar7 = ::std::max<unsigned_int>(&local_a0,&base_alignment);
        local_a0 = *puVar7;
        Bitset::~Bitset((Bitset *)local_e8);
      }
      bVar1 = packing_is_vec4_padded(local_2c);
      if (bVar1) {
        local_f0 = 0x10;
        puVar7 = ::std::max<unsigned_int>(&local_a0,&local_f0);
        local_a0 = *puVar7;
      }
      this_local._4_4_ = local_a0;
    }
    else {
      local_f4 = type_to_packed_base_size(this,(SPIRType *)flags_local,local_2c);
      bVar1 = packing_is_scalar(local_2c);
      if (bVar1) {
        this_local._4_4_ = local_f4;
      }
      else if ((*(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt == 1) &&
              (bVar1 = packing_is_hlsl(local_2c), bVar1)) {
        this_local._4_4_ = local_f4;
      }
      else if ((*(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) == 1) &&
              (*(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt == 1)) {
        this_local._4_4_ = local_f4;
      }
      else if (((*(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) == 2) ||
               (*(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) == 4)) &&
              (*(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt == 1)) {
        this_local._4_4_ =
             *(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) * local_f4;
      }
      else if ((*(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) == 3) &&
              (*(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt == 1)) {
        this_local._4_4_ = local_f4 << 2;
      }
      else {
        bVar1 = Bitset::get(pBStack_28,5);
        if ((bVar1) && (1 < *(uint *)&(flags_local->higher)._M_h._M_before_begin._M_nxt)) {
          bVar1 = packing_is_vec4_padded(local_2c);
          if (bVar1) {
            this_local._4_4_ = local_f4 << 2;
          }
          else if (*(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) == 3) {
            this_local._4_4_ = local_f4 << 2;
          }
          else {
            this_local._4_4_ =
                 *(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) * local_f4;
          }
        }
        else {
          bVar1 = Bitset::get(pBStack_28,4);
          if ((!bVar1) || (*(uint *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) < 2)) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_118,"Did not find suitable rule for type. Bogus decorations?",
                       &local_119);
            CompilerError::CompilerError(pCVar8,(string *)local_118);
            __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          bVar1 = packing_is_vec4_padded(local_2c);
          if (bVar1) {
            this_local._4_4_ = local_f4 << 2;
          }
          else if (*(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt == 3) {
            this_local._4_4_ = local_f4 << 2;
          }
          else {
            this_local._4_4_ = *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt * local_f4
            ;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_alignment(const SPIRType &type, const Bitset &flags,
                                                BufferPackingStandard packing)
{
	// If using PhysicalStorageBufferEXT storage class, this is a pointer,
	// and is 64-bit.
	if (type_is_top_level_physical_pointer(type))
	{
		if (!type.pointer)
			SPIRV_CROSS_THROW("Types in PhysicalStorageBufferEXT must be pointers.");

		if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
		{
			if (packing_is_vec4_padded(packing) && type_is_array_of_pointers(type))
				return 16;
			else
				return 8;
		}
		else
			SPIRV_CROSS_THROW("AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT.");
	}
	else if (type_is_top_level_array(type))
	{
		uint32_t minimum_alignment = 1;
		if (packing_is_vec4_padded(packing))
			minimum_alignment = 16;

		auto *tmp = &get<SPIRType>(type.parent_type);
		while (!tmp->array.empty())
			tmp = &get<SPIRType>(tmp->parent_type);

		// Get the alignment of the base type, then maybe round up.
		return max(minimum_alignment, type_to_packed_alignment(*tmp, flags, packing));
	}

	if (type.basetype == SPIRType::Struct)
	{
		// Rule 9. Structs alignments are maximum alignment of its members.
		uint32_t alignment = 1;
		for (uint32_t i = 0; i < type.member_types.size(); i++)
		{
			auto member_flags = ir.meta[type.self].members[i].decoration_flags;
			alignment =
			    max(alignment, type_to_packed_alignment(get<SPIRType>(type.member_types[i]), member_flags, packing));
		}

		// In std140, struct alignment is rounded up to 16.
		if (packing_is_vec4_padded(packing))
			alignment = max<uint32_t>(alignment, 16u);

		return alignment;
	}
	else
	{
		const uint32_t base_alignment = type_to_packed_base_size(type, packing);

		// Alignment requirement for scalar block layout is always the alignment for the most basic component.
		if (packing_is_scalar(packing))
			return base_alignment;

		// Vectors are *not* aligned in HLSL, but there's an extra rule where vectors cannot straddle
		// a vec4, this is handled outside since that part knows our current offset.
		if (type.columns == 1 && packing_is_hlsl(packing))
			return base_alignment;

		// From 7.6.2.2 in GL 4.5 core spec.
		// Rule 1
		if (type.vecsize == 1 && type.columns == 1)
			return base_alignment;

		// Rule 2
		if ((type.vecsize == 2 || type.vecsize == 4) && type.columns == 1)
			return type.vecsize * base_alignment;

		// Rule 3
		if (type.vecsize == 3 && type.columns == 1)
			return 4 * base_alignment;

		// Rule 4 implied. Alignment does not change in std430.

		// Rule 5. Column-major matrices are stored as arrays of
		// vectors.
		if (flags.get(DecorationColMajor) && type.columns > 1)
		{
			if (packing_is_vec4_padded(packing))
				return 4 * base_alignment;
			else if (type.vecsize == 3)
				return 4 * base_alignment;
			else
				return type.vecsize * base_alignment;
		}

		// Rule 6 implied.

		// Rule 7.
		if (flags.get(DecorationRowMajor) && type.vecsize > 1)
		{
			if (packing_is_vec4_padded(packing))
				return 4 * base_alignment;
			else if (type.columns == 3)
				return 4 * base_alignment;
			else
				return type.columns * base_alignment;
		}

		// Rule 8 implied.
	}

	SPIRV_CROSS_THROW("Did not find suitable rule for type. Bogus decorations?");
}